

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_mp3__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong uVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t bytesRemaining;
  ma_dr_mp3 *pMP3;
  undefined8 local_18;
  
  uVar1 = *(long *)(in_RDI + 0x3eb0) - *(long *)(in_RDI + 0x3eb8);
  local_18 = in_RDX;
  if (uVar1 < in_RDX) {
    local_18 = uVar1;
  }
  if (local_18 != 0) {
    memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x3ea8) + *(long *)(in_RDI + 0x3eb8)),local_18);
    *(ulong *)(in_RDI + 0x3eb8) = local_18 + *(long *)(in_RDI + 0x3eb8);
  }
  return local_18;
}

Assistant:

static size_t ma_dr_mp3__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    ma_dr_mp3* pMP3 = (ma_dr_mp3*)pUserData;
    size_t bytesRemaining;
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(pMP3->memory.dataSize >= pMP3->memory.currentReadPos);
    bytesRemaining = pMP3->memory.dataSize - pMP3->memory.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }
    if (bytesToRead > 0) {
        MA_DR_MP3_COPY_MEMORY(pBufferOut, pMP3->memory.pData + pMP3->memory.currentReadPos, bytesToRead);
        pMP3->memory.currentReadPos += bytesToRead;
    }
    return bytesToRead;
}